

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacintoshIMG.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::MacintoshIMG::get_track_at_position(MacintoshIMG *this,Address address)

{
  uint8_t type;
  int iVar1;
  SectorSpan SVar2;
  long lVar3;
  size_type sVar4;
  reference pvVar5;
  MacintoshIMG *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Storage::Disk::Track> sVar6;
  _Bit_pointer local_4e8;
  undefined1 local_4a8 [104];
  PCMSegment local_440;
  PCMSegment local_3e8;
  PCMSegment local_390;
  undefined8 local_338;
  uint8_t sector_plus_tags [524];
  int iStack_124;
  uint8_t sector_id;
  int c_1;
  int c;
  int destination;
  uint8_t source_sectors [12];
  undefined1 local_b8 [8];
  PCMSegment segment;
  uint8_t *tags;
  uint8_t *sector;
  size_t start_sector;
  int local_30;
  int iStack_2c;
  SectorSpan included_sectors;
  lock_guard<std::mutex> buffer_lock;
  MacintoshIMG *this_local;
  Address address_local;
  
  this_local = in_RDX;
  address_local = (Address)this;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&included_sectors,(mutex_type *)((long)address + 0x130));
  if ((*(int *)((long)address + 0xf0) == 0) || (*(int *)((long)address + 0xf0) == 1)) {
    iVar1 = HeadPosition::as_int((HeadPosition *)((long)&this_local + 4));
    SVar2 = Encodings::AppleGCR::Macintosh::sectors_in_track(iVar1);
    local_30 = SVar2.start;
    iVar1 = get_head_count((MacintoshIMG *)address);
    iStack_2c = SVar2.length;
    lVar3 = (long)(local_30 * iVar1 + iStack_2c * (int)this_local);
    sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       ((long)address + 0xf8));
    if ((ulong)(lVar3 << 9) < sVar4) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          ((long)address + 0xf8),lVar3 << 9);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         ((long)address + 0x110));
      if (sVar4 == 0) {
        local_4e8 = (_Bit_pointer)0x0;
      }
      else {
        local_4e8 = (_Bit_pointer)
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)address + 0x110),lVar3 * 0xc);
      }
      segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
      ._M_end_of_storage = local_4e8;
      PCMSegment::PCMSegment((PCMSegment *)local_b8);
      Encodings::AppleGCR::six_and_two_sync((PCMSegment *)(source_sectors + 4),0x18);
      PCMSegment::operator+=((PCMSegment *)local_b8,(PCMSegment *)(source_sectors + 4));
      PCMSegment::~PCMSegment((PCMSegment *)(source_sectors + 4));
      _c = 0xffffffffffffffff;
      source_sectors[0] = 0xff;
      source_sectors[1] = 0xff;
      source_sectors[2] = 0xff;
      source_sectors[3] = 0xff;
      c_1 = 0;
      for (iStack_124 = 0; iStack_124 < iStack_2c; iStack_124 = iStack_124 + 1) {
        for (; *(char *)((long)&c + (long)c_1) != -1; c_1 = (c_1 + 1) % iStack_2c) {
        }
        *(char *)((long)&c + (long)c_1) = (char)iStack_124;
        c_1 = (int)(c_1 + (*(byte *)((long)address + 0xf4) & 0x1f)) % iStack_2c;
      }
      sector_plus_tags[0x208] = '\0';
      sector_plus_tags[0x209] = '\0';
      sector_plus_tags[0x20a] = '\0';
      sector_plus_tags[0x20b] = '\0';
      for (; (int)sector_plus_tags._520_4_ < iStack_2c;
          sector_plus_tags._520_4_ = sector_plus_tags._520_4_ + 1) {
        sector_plus_tags[0x207] = *(byte *)((long)&c + (long)(int)sector_plus_tags._520_4_);
        if (segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_end_of_storage == (_Bit_pointer)0x0) {
          memset(&local_338,0,0xc);
        }
        else {
          local_338 = *(undefined8 *)
                       ((long)segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage +
                       (long)(int)((uint)sector_plus_tags[0x207] * 0xc));
          sector_plus_tags._0_4_ =
               *(undefined4 *)
                ((long)segment.fuzzy_mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage +
                (long)(int)((uint)sector_plus_tags[0x207] * 0xc) + 8);
        }
        memcpy(sector_plus_tags + 4,pvVar5 + (ulong)sector_plus_tags[0x207] * 0x200,0x200);
        type = *(uint8_t *)((long)address + 0xf4);
        iVar1 = HeadPosition::as_int((HeadPosition *)((long)&this_local + 4));
        Encodings::AppleGCR::Macintosh::header
                  (&local_390,type,(uint8_t)iVar1,sector_plus_tags[0x207],(int)this_local != 0);
        PCMSegment::operator+=((PCMSegment *)local_b8,&local_390);
        PCMSegment::~PCMSegment(&local_390);
        Encodings::AppleGCR::six_and_two_sync(&local_3e8,7);
        PCMSegment::operator+=((PCMSegment *)local_b8,&local_3e8);
        PCMSegment::~PCMSegment(&local_3e8);
        Encodings::AppleGCR::Macintosh::data
                  (&local_440,sector_plus_tags[0x207],(uint8_t *)&local_338);
        PCMSegment::operator+=((PCMSegment *)local_b8,&local_440);
        PCMSegment::~PCMSegment(&local_440);
        Encodings::AppleGCR::six_and_two_sync((PCMSegment *)(local_4a8 + 0x10),0x14);
        PCMSegment::operator+=((PCMSegment *)local_b8,(PCMSegment *)(local_4a8 + 0x10));
        PCMSegment::~PCMSegment((PCMSegment *)(local_4a8 + 0x10));
      }
      std::make_shared<Storage::Disk::PCMTrack,Storage::Disk::PCMSegment&>((PCMSegment *)local_4a8);
      std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::PCMTrack,void>
                ((shared_ptr<Storage::Disk::Track> *)this,
                 (shared_ptr<Storage::Disk::PCMTrack> *)local_4a8);
      std::shared_ptr<Storage::Disk::PCMTrack>::~shared_ptr
                ((shared_ptr<Storage::Disk::PCMTrack> *)local_4a8);
      PCMSegment::~PCMSegment((PCMSegment *)local_b8);
    }
    else {
      std::shared_ptr<Storage::Disk::Track>::shared_ptr
                ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
    }
  }
  else {
    std::shared_ptr<Storage::Disk::Track>::shared_ptr
              ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&included_sectors);
  sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar6.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> MacintoshIMG::get_track_at_position(::Storage::Disk::Track::Address address) {
	/*
		The format_ byte has the following meanings:

		GCR:
			This byte appears on disk as the GCR format nibble in every sector tag.
			The low five bits are an interleave factor, either:

				'2' for 0 8 1 9 2 10 3 11 4 12 5 13 6 14 7 15; or
				'4' for 0 4 8 12 1 5 9 13 2 6 10 14 3 7 11 15.

			Bit 5 indicates double sided or not.

		MFM:
			The low five bits provide sector size as a multiple of 256 bytes.
			Bit 5 indicates double sided or not.
	*/

	std::lock_guard buffer_lock(buffer_mutex_);
	if(encoding_ == Encoding::GCR400 || encoding_ == Encoding::GCR800) {
		// Perform a GCR encoding.
		const auto included_sectors = Storage::Encodings::AppleGCR::Macintosh::sectors_in_track(address.position.as_int());
		const size_t start_sector = size_t(included_sectors.start * get_head_count() + included_sectors.length * address.head);

		if(start_sector*512 >= data_.size()) return nullptr;

		uint8_t *const sector = &data_[512 * start_sector];
		uint8_t *const tags = tags_.size() ? &tags_[12 * start_sector] : nullptr;

		Storage::Disk::PCMSegment segment;
		segment += Encodings::AppleGCR::six_and_two_sync(24);

		// Determine the sector ordering.
		uint8_t source_sectors[12] = {0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff};
		int destination = 0;
		for(int c = 0; c < included_sectors.length; ++c) {
			// Deal with collisions by finding the next non-colliding spot.
			while(source_sectors[destination] != 0xff) destination = (destination + 1) % included_sectors.length;
			source_sectors[destination] = uint8_t(c);
			destination = (destination + (format_ & 0x1f)) % included_sectors.length;
		}

		for(int c = 0; c < included_sectors.length; ++c) {
			const uint8_t sector_id = source_sectors[c];
			uint8_t sector_plus_tags[524];

			// Copy in the tags, if provided; otherwise generate them.
			if(tags) {
				memcpy(sector_plus_tags, &tags[sector_id * 12], 12);
			} else {
				// TODO: fill in tags properly.
				memset(sector_plus_tags, 0, 12);
			}

			// Copy in the sector body.
			memcpy(&sector_plus_tags[12], &sector[sector_id * 512], 512);

			// NB: sync lengths below are identical to those for
			// the Apple II, as I have no idea whatsoever what they
			// should be.

			segment += Encodings::AppleGCR::Macintosh::header(
				format_,
				uint8_t(address.position.as_int()),
				sector_id,
				!!address.head
			);
			segment += Encodings::AppleGCR::six_and_two_sync(7);
			segment += Encodings::AppleGCR::Macintosh::data(sector_id, sector_plus_tags);
			segment += Encodings::AppleGCR::six_and_two_sync(20);
		}

		// TODO: it seems some tracks are skewed respective to others; investigate further.

//		segment.rotate_right(3000);	// Just a test, yo.
		return std::make_shared<PCMTrack>(segment);
	}

	return nullptr;
}